

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O2

void __thiscall
btGeneric6DofConstraint::btGeneric6DofConstraint
          (btGeneric6DofConstraint *this,btRigidBody *rbB,btTransform *frameInB,
          bool useLinearReferenceFrameB)

{
  undefined8 uVar1;
  btRigidBody *rbA;
  long lVar2;
  btTransform local_68;
  
  rbA = btTypedConstraint::getFixedBody();
  btTypedConstraint::btTypedConstraint(&this->super_btTypedConstraint,D6_CONSTRAINT_TYPE,rbA,rbB);
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_001f1158;
  uVar1 = *(undefined8 *)((frameInB->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[0].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInB->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[1].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInB->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[2].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInB->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_origin.m_floats = *(undefined8 *)(frameInB->m_origin).m_floats
  ;
  *(undefined8 *)((this->m_frameInB).m_origin.m_floats + 2) = uVar1;
  btTranslationalLimitMotor::btTranslationalLimitMotor(&this->m_linearLimits);
  lVar2 = 0x37c;
  do {
    btRotationalLimitMotor::btRotationalLimitMotor
              ((btRotationalLimitMotor *)
               ((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar2 + -0x48));
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x43c);
  this->m_useLinearReferenceFrameA = useLinearReferenceFrameB;
  this->m_useOffsetForConstraintFrame = true;
  this->m_flags = 0;
  this->m_useSolveConstraintObsolete = false;
  btTransform::operator*
            (&local_68,&(rbB->super_btCollisionObject).m_worldTransform,&this->m_frameInB);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[0].m_floats =
       local_68.m_basis.m_el[0].m_floats._0_8_;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[0].m_floats + 2) =
       local_68.m_basis.m_el[0].m_floats._8_8_;
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[1].m_floats =
       local_68.m_basis.m_el[1].m_floats._0_8_;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[1].m_floats + 2) =
       local_68.m_basis.m_el[1].m_floats._8_8_;
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[2].m_floats =
       local_68.m_basis.m_el[2].m_floats._0_8_;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[2].m_floats + 2) =
       local_68.m_basis.m_el[2].m_floats._8_8_;
  *(undefined8 *)(this->m_frameInA).m_origin.m_floats = local_68.m_origin.m_floats._0_8_;
  *(undefined8 *)((this->m_frameInA).m_origin.m_floats + 2) = local_68.m_origin.m_floats._8_8_;
  calculateTransforms(this);
  return;
}

Assistant:

btGeneric6DofConstraint::btGeneric6DofConstraint(btRigidBody& rbB, const btTransform& frameInB, bool useLinearReferenceFrameB)
        : btTypedConstraint(D6_CONSTRAINT_TYPE, getFixedBody(), rbB),
		m_frameInB(frameInB),
		m_useLinearReferenceFrameA(useLinearReferenceFrameB),
		m_useOffsetForConstraintFrame(D6_USE_FRAME_OFFSET),
		m_flags(0),
		m_useSolveConstraintObsolete(false)
{
	///not providing rigidbody A means implicitly using worldspace for body A
	m_frameInA = rbB.getCenterOfMassTransform() * m_frameInB;
	calculateTransforms();
}